

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O0

void duckdb_brotli::BrotliCompressFragmentTwoPass
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t table_size,
               size_t *storage_ix,uint8_t *storage)

{
  size_t new_storage_ix;
  uint uVar1;
  uint8_t *input_00;
  ulong *puVar2;
  int in_ECX;
  uint32_t *in_RDX;
  undefined8 in_RSI;
  size_t in_RDI;
  uint8_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  size_t *in_stack_00000018;
  size_t table_bits;
  size_t initial_storage_ix;
  uint64_t v_1;
  uint8_t *p_1;
  uint64_t v;
  uint8_t *p;
  int *in_stack_000008f0;
  size_t *in_stack_000008f8;
  uint8_t *in_stack_00000900;
  uint8_t *in_stack_ffffffffffffff18;
  size_t *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff58;
  int is_last_00;
  BrotliTwoPassArena *in_stack_ffffffffffffff80;
  
  new_storage_ix = *in_stack_00000018;
  uVar1 = 0x1f;
  if ((uint)in_stack_00000010 != 0) {
    for (; (uint)in_stack_00000010 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  input_00 = (uint8_t *)((ulong)uVar1 - 8);
  is_last_00 = (int)((ulong)in_RSI >> 0x20);
  switch(input_00) {
  case (uint8_t *)0x0:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl8
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x1:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl9
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x2:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl10
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x3:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl11
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x4:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl12
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x5:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl13
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x6:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl14
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x7:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl15
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x8:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl16
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
    break;
  case (uint8_t *)0x9:
    in_stack_ffffffffffffff20 = in_stack_00000018;
    in_stack_ffffffffffffff28 = table_bits;
    BrotliCompressFragmentTwoPassImpl17
              (in_stack_ffffffffffffff80,in_stack_00000010,in_RDI,is_last_00,in_RDX,
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff58),in_stack_000008f0,
               in_stack_000008f8,in_stack_00000900);
    in_stack_ffffffffffffff18 = in_stack_00000008;
  }
  if ((long)in_RDX * 8 + 0x1fU < *in_stack_00000018 - new_storage_ix) {
    RewindBitPosition(new_storage_ix,in_stack_00000018,(uint8_t *)table_bits);
    EmitUncompressedMetaBlock
              (input_00,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
  }
  if (in_ECX != 0) {
    puVar2 = (ulong *)(table_bits + (*in_stack_00000018 >> 3));
    *puVar2 = 1L << ((byte)*in_stack_00000018 & 7) | (ulong)(byte)*puVar2;
    *in_stack_00000018 = *in_stack_00000018 + 1;
    puVar2 = (ulong *)(table_bits + (*in_stack_00000018 >> 3));
    *puVar2 = 1L << ((byte)*in_stack_00000018 & 7) | (ulong)(byte)*puVar2;
    *in_stack_00000018 = *in_stack_00000018 + 1;
    *in_stack_00000018 = *in_stack_00000018 + 7 & 0xfffffff8;
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}